

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

string * __thiscall
vera::toString_abi_cxx11_
          (string *__return_storage_ptr__,vera *this,vec4 *_vec,char _sep,int _precision)

{
  char cVar1;
  ostream *poVar2;
  undefined7 in_register_00000009;
  long lVar3;
  ostringstream strStream;
  long local_1a0;
  long local_198 [2];
  uint auStack_188 [88];
  
  cVar1 = (char)_vec;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
  lVar3 = (long)(int)CONCAT71(in_register_00000009,_sep);
  *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = lVar3;
  poVar2 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a0,*(float *)this);
  std::operator<<(poVar2,cVar1);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
  *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = lVar3;
  poVar2 = (ostream *)std::ostream::operator<<(&local_1a0,*(float *)(this + 4));
  std::operator<<(poVar2,cVar1);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
  *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = lVar3;
  poVar2 = (ostream *)std::ostream::operator<<(&local_1a0,*(float *)(this + 8));
  std::operator<<(poVar2,cVar1);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
  *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = lVar3;
  std::ostream::operator<<(&local_1a0,*(float *)(this + 0xc));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const glm::vec4& _vec, char _sep, int _precision) {
    std::ostringstream strStream;
    strStream << std::fixed << std::setprecision(_precision) << _vec.x << _sep;
    strStream << std::fixed << std::setprecision(_precision) << _vec.y << _sep;
    strStream << std::fixed << std::setprecision(_precision) << _vec.z << _sep; 
    strStream << std::fixed << std::setprecision(_precision) << _vec.w;
    return strStream.str();
}